

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::TabItemEx(ImGuiTabBar *tab_bar,char *label,bool *p_open,ImGuiTabItemFlags flags)

{
  ImVec2 *pIVar1;
  ImGuiTabItem *pIVar2;
  short sVar3;
  int iVar4;
  uint uVar5;
  ImDrawList *draw_list;
  ImVec2 IVar6;
  uint3 uVar7;
  ImGuiContext *pIVar8;
  char *pcVar9;
  ImGuiWindow *pIVar10;
  ulong uVar11;
  undefined1 uVar12;
  bool bVar13;
  ImU32 id;
  int iVar14;
  undefined4 uVar15;
  ImU32 col;
  ImGuiID close_button_id;
  ulong uVar16;
  ImGuiTabItem *pIVar17;
  size_t sVar18;
  ulong extraout_RAX;
  undefined7 uVar20;
  char *pcVar19;
  int iVar21;
  ImGuiTabItem *pIVar22;
  int iVar23;
  int iVar24;
  ImGuiTabItem *pIVar25;
  ImGuiCol idx;
  ulong uVar26;
  uint flags_00;
  bool bVar27;
  uint uVar28;
  float fVar29;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  ImVec2 IVar30;
  float fVar31;
  bool text_clipped;
  bool just_closed;
  ImGuiTextBuffer *local_b0;
  ImRect bb;
  bool held;
  float local_6c;
  bool *local_68;
  char *local_60;
  bool hovered;
  float fStack_54;
  int local_50;
  int local_4c;
  undefined1 local_48 [16];
  ImGuiWindow *local_38;
  
  pIVar25 = (ImGuiTabItem *)(ulong)(uint)flags;
  if (tab_bar->WantLayout == true) {
    TabBarLayout(tab_bar);
  }
  pIVar8 = GImGui;
  local_38 = GImGui->CurrentWindow;
  if (local_38->SkipItems != false) {
    return false;
  }
  id = TabBarCalcTabID(tab_bar,label);
  if ((p_open != (bool *)0x0) && (*p_open == false)) {
    bb.Min.x = 0.0;
    bb.Min.y = 0.0;
    bb.Max.x = 0.0;
    bb.Max.y = 0.0;
    ItemAdd(&bb,id,(ImRect *)0x0,0x18);
    return false;
  }
  local_68 = (bool *)0x0;
  flags_00 = flags;
  if (((uint)flags >> 0x14 & 1) == 0) {
    local_68 = p_open;
    flags_00 = flags | 0x100000;
  }
  if (p_open != (bool *)0x0) {
    flags_00 = flags;
  }
  IVar6 = TabItemCalcSize(label,local_68 != (bool *)0x0);
  fVar31 = IVar6.x;
  if (id == 0) {
LAB_0016d957:
    pIVar25 = (ImGuiTabItem *)0x0;
  }
  else {
    uVar16 = (ulong)(tab_bar->Tabs).Size;
    bVar27 = 0 < (long)uVar16;
    if (0 < (long)uVar16) {
      pIVar25 = (tab_bar->Tabs).Data;
      bVar27 = true;
      if (pIVar25->ID != id) {
        pIVar17 = pIVar25 + (uVar16 - 1);
        uVar11 = 1;
        pIVar22 = pIVar25;
        do {
          uVar26 = uVar11;
          pIVar25 = pIVar17;
          if (uVar16 == uVar26) break;
          pIVar25 = pIVar22 + 1;
          pIVar2 = pIVar22 + 1;
          uVar11 = uVar26 + 1;
          pIVar22 = pIVar25;
        } while (pIVar2->ID != id);
        bVar27 = uVar26 < uVar16;
      }
    }
    if (!bVar27) goto LAB_0016d957;
  }
  local_48._8_4_ = extraout_XMM0_Dc;
  local_48._0_4_ = IVar6.x;
  local_48._4_4_ = IVar6.y;
  local_48._12_4_ = extraout_XMM0_Dd;
  pIVar22 = pIVar25;
  local_60 = label;
  if (pIVar25 == (ImGuiTabItem *)0x0) {
    iVar24 = (tab_bar->Tabs).Size;
    iVar4 = (tab_bar->Tabs).Capacity;
    if (iVar24 == iVar4) {
      iVar24 = iVar24 + 1;
      if (iVar4 == 0) {
        iVar21 = 8;
      }
      else {
        iVar21 = iVar4 / 2 + iVar4;
      }
      if (iVar24 < iVar21) {
        iVar24 = iVar21;
      }
      if (iVar4 < iVar24) {
        pIVar17 = (ImGuiTabItem *)MemAlloc((long)iVar24 * 0x28);
        pIVar22 = (tab_bar->Tabs).Data;
        if (pIVar22 != (ImGuiTabItem *)0x0) {
          memcpy(pIVar17,pIVar22,(long)(tab_bar->Tabs).Size * 0x28);
          MemFree((tab_bar->Tabs).Data);
        }
        (tab_bar->Tabs).Data = pIVar17;
        (tab_bar->Tabs).Capacity = iVar24;
        fVar31 = (float)local_48._0_4_;
      }
    }
    pIVar22 = (tab_bar->Tabs).Data;
    iVar24 = (tab_bar->Tabs).Size;
    pIVar22[iVar24].ID = 0;
    pIVar22[iVar24].Flags = 0;
    pIVar22[iVar24].LastFrameVisible = -1;
    pIVar22[iVar24].LastFrameSelected = -1;
    pIVar22[iVar24].Offset = 0.0;
    pIVar22[iVar24].Width = 0.0;
    pIVar22[iVar24].ContentWidth = 0.0;
    pIVar17 = pIVar22 + iVar24;
    pIVar17->NameOffset = -1;
    pIVar17->BeginOrder = -1;
    pIVar17->IndexDuringLayout = -1;
    *(undefined4 *)&pIVar22[iVar24].WantClose = 0;
    iVar24 = (tab_bar->Tabs).Size;
    (tab_bar->Tabs).Size = iVar24 + 1;
    pIVar17 = (tab_bar->Tabs).Data;
    pIVar22 = pIVar17 + iVar24;
    pIVar22->ID = id;
    pIVar17[iVar24].Width = fVar31;
    tab_bar->TabsAddedNew = true;
  }
  pcVar9 = local_60;
  tab_bar->LastTabItemIdx =
       (short)((uint)((int)pIVar22 - *(int *)&(tab_bar->Tabs).Data) >> 3) * -0x3333;
  pIVar22->ContentWidth = fVar31;
  sVar3 = tab_bar->TabsActiveCount;
  tab_bar->TabsActiveCount = sVar3 + 1;
  pIVar22->BeginOrder = sVar3;
  uVar5 = tab_bar->Flags;
  iVar14 = tab_bar->PrevFrameVisible + 1;
  iVar24 = pIVar8->FrameCount;
  iVar23 = pIVar22->LastFrameVisible + 1;
  pIVar22->LastFrameVisible = iVar24;
  pIVar22->Flags = flags_00;
  local_b0 = &tab_bar->TabsNames;
  iVar4 = (tab_bar->TabsNames).Buf.Size;
  iVar21 = iVar4 + -1;
  if (iVar4 == 0) {
    iVar21 = 0;
  }
  pIVar22->NameOffset = iVar21;
  sVar18 = strlen(local_60);
  ImGuiTextBuffer::append(local_b0,pcVar9,pcVar9 + sVar18 + 1);
  pIVar10 = local_38;
  uVar16 = extraout_RAX;
  if (((iVar23 < iVar24) && ((tab_bar->Flags & 2) != 0)) && (tab_bar->NextSelectedTabId == 0)) {
    if (iVar14 < iVar24) {
      uVar28 = flags_00 & 0x200000 | tab_bar->SelectedTabId;
      uVar16 = (ulong)uVar28;
    }
    else {
      uVar28 = flags_00 >> 0x15 & 1;
    }
    if (uVar28 == 0) {
      tab_bar->NextSelectedTabId = id;
    }
  }
  if ((((flags_00 & 2) != 0) && (tab_bar->SelectedTabId != id)) &&
     (uVar16 = (ulong)(flags_00 & 0x200000), (flags_00 & 0x200000) == 0)) {
    tab_bar->NextSelectedTabId = id;
  }
  uVar20 = (undefined7)(uVar16 >> 8);
  if (tab_bar->VisibleTabId == id) {
    tab_bar->VisibleTabWasSubmitted = true;
    local_b0 = (ImGuiTextBuffer *)CONCAT71(uVar20,1);
  }
  else if ((tab_bar->SelectedTabId == 0 && iVar14 < iVar24) && ((tab_bar->Tabs).Size == 1)) {
    local_b0 = (ImGuiTextBuffer *)CONCAT71(uVar20,(tab_bar->Flags & 2) == 0);
  }
  else {
    local_b0 = (ImGuiTextBuffer *)0x0;
  }
  if ((iVar23 < iVar24) && (pIVar25 == (ImGuiTabItem *)0x0 || iVar24 <= iVar14)) {
    bb.Min.x = 0.0;
    bb.Min.y = 0.0;
    bb.Max.x = 0.0;
    bb.Max.y = 0.0;
    ItemAdd(&bb,id,(ImRect *)0x0,0x18);
    return (bool)((flags_00 >> 0x15 & 1) == 0 & (byte)local_b0);
  }
  if (tab_bar->SelectedTabId == id) {
    pIVar22->LastFrameSelected = pIVar8->FrameCount;
  }
  uVar28 = pIVar22->Flags;
  fVar31 = pIVar22->Width;
  fVar29 = pIVar22->Offset;
  if ((uVar28 & 0xc0) == 0) {
    fVar29 = (float)(int)(fVar29 - tab_bar->ScrollingAnim);
  }
  bb.Min.x = fVar29 + (tab_bar->BarRect).Min.x;
  IVar6 = (local_38->DC).CursorPos;
  bb.Min.y = (tab_bar->BarRect).Min.y + 0.0;
  IVar30.y = bb.Min.y;
  IVar30.x = bb.Min.x;
  (local_38->DC).CursorPos = IVar30;
  fVar31 = fVar31 + bb.Min.x;
  fVar29 = (float)local_48._4_4_ + bb.Min.y;
  bb.Max.y = fVar29;
  bb.Max.x = fVar31;
  if ((uVar28 & 0xc0) == 0) {
    uVar7 = (uint3)(uVar28 >> 8);
    uVar15 = (undefined4)CONCAT71((uint7)uVar7,1);
    if (tab_bar->ScrollingRectMinX <= bb.Min.x) {
      uVar15 = CONCAT31(uVar7,tab_bar->ScrollingRectMaxX <= fVar31 &&
                              fVar31 != tab_bar->ScrollingRectMaxX);
    }
  }
  else {
    uVar15 = 0;
  }
  local_48._0_4_ = uVar15;
  local_50 = iVar23;
  local_4c = iVar24;
  if ((char)uVar15 != '\0') {
    uVar28 = -(uint)(tab_bar->ScrollingRectMinX <= bb.Min.x);
    fStack_54 = bb.Min.y + -1.0;
    _hovered = (float)(~uVar28 & (uint)tab_bar->ScrollingRectMinX | (uint)bb.Min.x & uVar28);
    _held = tab_bar->ScrollingRectMaxX;
    local_6c = fVar29;
    PushClipRect((ImVec2 *)&hovered,(ImVec2 *)&held,true);
  }
  IVar30 = (pIVar10->DC).CursorMaxPos;
  fStack_54 = bb.Max.y - bb.Min.y;
  _hovered = bb.Max.x - bb.Min.x;
  ItemSize((ImVec2 *)&hovered,(pIVar8->Style).FramePadding.y);
  (pIVar10->DC).CursorMaxPos = IVar30;
  bVar27 = ItemAdd(&bb,id,(ImRect *)0x0,0);
  if (!bVar27) {
    if (local_48[0] != '\0') {
      PopClipRect();
    }
    (pIVar10->DC).CursorPos = IVar6;
    return (bool)(char)local_b0;
  }
  uVar28 = flags_00 & 0x200000;
  uVar12 = ButtonBehavior(&bb,id,&hovered,&held,
                          (uVar28 >> 0x11) + (uint)pIVar8->DragDropActive * 0x200 + 0x1010);
  if (((bool)uVar12) && (uVar28 == 0)) {
    tab_bar->NextSelectedTabId = id;
  }
  if (pIVar8->ActiveId != id) {
    SetItemAllowOverlap();
  }
  if (((((held == true) && (local_4c <= local_50)) && (bVar27 = IsMouseDragging(0,-1.0), bVar27)) &&
      ((pIVar8->DragDropActive == false && ((tab_bar->Flags & 1) != 0)))) &&
     (((fVar31 = (pIVar8->IO).MouseDelta.x, fVar31 < 0.0 &&
       (pIVar1 = &(pIVar8->IO).MousePos, pIVar1->x <= bb.Min.x && bb.Min.x != pIVar1->x)) ||
      ((0.0 < fVar31 && (bb.Max.x < (pIVar8->IO).MousePos.x)))))) {
    TabBarQueueReorderFromMousePos(tab_bar,pIVar22,(pIVar8->IO).MousePos);
  }
  pcVar9 = local_60;
  draw_list = pIVar10->DrawList;
  idx = 0x22;
  if ((held == false) && (hovered == false)) {
    if ((byte)local_b0 == '\0') {
      idx = (uint)((uVar5 >> 0x15 & 1) == 0) * 3 + 0x21;
    }
    else {
      idx = (uint)((uVar5 >> 0x15 & 1) == 0) * 2 + 0x23;
    }
  }
  col = GetColorU32(idx,1.0);
  TabItemBackground(draw_list,&bb,flags_00,col);
  RenderNavHighlight(&bb,id,1);
  bVar27 = IsItemHovered(0x20);
  if (bVar27) {
    bVar27 = IsMouseClicked(1,false);
    if (bVar27) {
      uVar28 = flags_00 >> 0x15 & 1;
    }
    else {
      bVar27 = IsMouseReleased(1);
      if (!bVar27) goto LAB_0016dee6;
    }
    if (uVar28 == 0) {
      tab_bar->NextSelectedTabId = id;
    }
  }
LAB_0016dee6:
  uVar5 = tab_bar->Flags;
  if (local_68 == (bool *)0x0) {
    close_button_id = 0;
  }
  else {
    close_button_id = GetIDWithSeed("#CLOSE",(char *)0x0,id);
  }
  bVar27 = (bool)(byte)local_b0;
  TabItemLabelAndCloseButton
            (draw_list,&bb,uVar5 >> 1 & 4 | flags_00,tab_bar->FramePadding,pcVar9,id,close_button_id
             ,(bool)(byte)local_b0,&just_closed,&text_clipped);
  if ((local_68 != (bool *)0x0) && (just_closed != false)) {
    *local_68 = false;
    if ((pIVar22->Flags & 1) == 0) {
      pIVar22->WantClose = true;
      if (tab_bar->VisibleTabId == pIVar22->ID) {
        pIVar22->LastFrameVisible = -1;
        tab_bar->SelectedTabId = 0;
        tab_bar->NextSelectedTabId = 0;
      }
    }
    else if (tab_bar->VisibleTabId != pIVar22->ID) {
      tab_bar->NextSelectedTabId = pIVar22->ID;
    }
  }
  if (local_48[0] != '\0') {
    PopClipRect();
  }
  (local_38->DC).CursorPos = IVar6;
  if ((((text_clipped == true) && (pIVar8->HoveredId == id)) && (held == false)) &&
     (((pIVar8->TooltipSlowDelay <= pIVar8->HoveredIdNotActiveTimer &&
        pIVar8->HoveredIdNotActiveTimer != pIVar8->TooltipSlowDelay &&
       (bVar13 = IsItemHovered(0), bVar13)) &&
      (((tab_bar->Flags & 0x20) == 0 && ((pIVar22->Flags & 0x10) == 0)))))) {
    pcVar19 = FindRenderedTextEnd(pcVar9,(char *)0x0);
    SetTooltip("%.*s",(ulong)(uint)((int)pcVar19 - (int)pcVar9),pcVar9);
  }
  if ((flags_00 >> 0x15 & 1) == 0) {
    uVar12 = bVar27;
  }
  return (bool)uVar12;
}

Assistant:

bool    ImGui::TabItemEx(ImGuiTabBar* tab_bar, const char* label, bool* p_open, ImGuiTabItemFlags flags)
{
    // Layout whole tab bar if not already done
    if (tab_bar->WantLayout)
        TabBarLayout(tab_bar);

    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = TabBarCalcTabID(tab_bar, label);

    // If the user called us with *p_open == false, we early out and don't render.
    // We make a call to ItemAdd() so that attempts to use a contextual popup menu with an implicit ID won't use an older ID.
    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, g.LastItemData.StatusFlags);
    if (p_open && !*p_open)
    {
        ItemAdd(ImRect(), id, NULL, ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus);
        return false;
    }

    IM_ASSERT(!p_open || !(flags & ImGuiTabItemFlags_Button));
    IM_ASSERT((flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)) != (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)); // Can't use both Leading and Trailing

    // Store into ImGuiTabItemFlags_NoCloseButton, also honor ImGuiTabItemFlags_NoCloseButton passed by user (although not documented)
    if (flags & ImGuiTabItemFlags_NoCloseButton)
        p_open = NULL;
    else if (p_open == NULL)
        flags |= ImGuiTabItemFlags_NoCloseButton;

    // Calculate tab contents size
    ImVec2 size = TabItemCalcSize(label, p_open != NULL);

    // Acquire tab data
    ImGuiTabItem* tab = TabBarFindTabByID(tab_bar, id);
    bool tab_is_new = false;
    if (tab == NULL)
    {
        tab_bar->Tabs.push_back(ImGuiTabItem());
        tab = &tab_bar->Tabs.back();
        tab->ID = id;
        tab->Width = size.x;
        tab_bar->TabsAddedNew = true;
        tab_is_new = true;
    }
    tab_bar->LastTabItemIdx = (ImS16)tab_bar->Tabs.index_from_ptr(tab);
    tab->ContentWidth = size.x;
    tab->BeginOrder = tab_bar->TabsActiveCount++;

    const bool tab_bar_appearing = (tab_bar->PrevFrameVisible + 1 < g.FrameCount);
    const bool tab_bar_focused = (tab_bar->Flags & ImGuiTabBarFlags_IsFocused) != 0;
    const bool tab_appearing = (tab->LastFrameVisible + 1 < g.FrameCount);
    const bool is_tab_button = (flags & ImGuiTabItemFlags_Button) != 0;
    tab->LastFrameVisible = g.FrameCount;
    tab->Flags = flags;

    // Append name with zero-terminator
    tab->NameOffset = (ImS32)tab_bar->TabsNames.size();
    tab_bar->TabsNames.append(label, label + strlen(label) + 1);

    // Update selected tab
    if (tab_appearing && (tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs) && tab_bar->NextSelectedTabId == 0)
        if (!tab_bar_appearing || tab_bar->SelectedTabId == 0)
            if (!is_tab_button)
                tab_bar->NextSelectedTabId = id;  // New tabs gets activated
    if ((flags & ImGuiTabItemFlags_SetSelected) && (tab_bar->SelectedTabId != id)) // SetSelected can only be passed on explicit tab bar
        if (!is_tab_button)
            tab_bar->NextSelectedTabId = id;

    // Lock visibility
    // (Note: tab_contents_visible != tab_selected... because CTRL+TAB operations may preview some tabs without selecting them!)
    bool tab_contents_visible = (tab_bar->VisibleTabId == id);
    if (tab_contents_visible)
        tab_bar->VisibleTabWasSubmitted = true;

    // On the very first frame of a tab bar we let first tab contents be visible to minimize appearing glitches
    if (!tab_contents_visible && tab_bar->SelectedTabId == 0 && tab_bar_appearing)
        if (tab_bar->Tabs.Size == 1 && !(tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs))
            tab_contents_visible = true;

    // Note that tab_is_new is not necessarily the same as tab_appearing! When a tab bar stops being submitted
    // and then gets submitted again, the tabs will have 'tab_appearing=true' but 'tab_is_new=false'.
    if (tab_appearing && (!tab_bar_appearing || tab_is_new))
    {
        ItemAdd(ImRect(), id, NULL, ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus);
        if (is_tab_button)
            return false;
        return tab_contents_visible;
    }

    if (tab_bar->SelectedTabId == id)
        tab->LastFrameSelected = g.FrameCount;

    // Backup current layout position
    const ImVec2 backup_main_cursor_pos = window->DC.CursorPos;

    // Layout
    const bool is_central_section = (tab->Flags & ImGuiTabItemFlags_SectionMask_) == 0;
    size.x = tab->Width;
    if (is_central_section)
        window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2(IM_FLOOR(tab->Offset - tab_bar->ScrollingAnim), 0.0f);
    else
        window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2(tab->Offset, 0.0f);
    ImVec2 pos = window->DC.CursorPos;
    ImRect bb(pos, pos + size);

    // We don't have CPU clipping primitives to clip the CloseButton (until it becomes a texture), so need to add an extra draw call (temporary in the case of vertical animation)
    const bool want_clip_rect = is_central_section && (bb.Min.x < tab_bar->ScrollingRectMinX || bb.Max.x > tab_bar->ScrollingRectMaxX);
    if (want_clip_rect)
        PushClipRect(ImVec2(ImMax(bb.Min.x, tab_bar->ScrollingRectMinX), bb.Min.y - 1), ImVec2(tab_bar->ScrollingRectMaxX, bb.Max.y), true);

    ImVec2 backup_cursor_max_pos = window->DC.CursorMaxPos;
    ItemSize(bb.GetSize(), style.FramePadding.y);
    window->DC.CursorMaxPos = backup_cursor_max_pos;

    if (!ItemAdd(bb, id))
    {
        if (want_clip_rect)
            PopClipRect();
        window->DC.CursorPos = backup_main_cursor_pos;
        return tab_contents_visible;
    }

    // Click to Select a tab
    ImGuiButtonFlags button_flags = ((is_tab_button ? ImGuiButtonFlags_PressedOnClickRelease : ImGuiButtonFlags_PressedOnClick) | ImGuiButtonFlags_AllowItemOverlap);
    if (g.DragDropActive)
        button_flags |= ImGuiButtonFlags_PressedOnDragDropHold;
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, button_flags);
    if (pressed && !is_tab_button)
        tab_bar->NextSelectedTabId = id;

    // Allow the close button to overlap unless we are dragging (in which case we don't want any overlapping tabs to be hovered)
    if (g.ActiveId != id)
        SetItemAllowOverlap();

    // Drag and drop: re-order tabs
    if (held && !tab_appearing && IsMouseDragging(0))
    {
        if (!g.DragDropActive && (tab_bar->Flags & ImGuiTabBarFlags_Reorderable))
        {
            // While moving a tab it will jump on the other side of the mouse, so we also test for MouseDelta.x
            if (g.IO.MouseDelta.x < 0.0f && g.IO.MousePos.x < bb.Min.x)
            {
                TabBarQueueReorderFromMousePos(tab_bar, tab, g.IO.MousePos);
            }
            else if (g.IO.MouseDelta.x > 0.0f && g.IO.MousePos.x > bb.Max.x)
            {
                TabBarQueueReorderFromMousePos(tab_bar, tab, g.IO.MousePos);
            }
        }
    }

#if 0
    if (hovered && g.HoveredIdNotActiveTimer > TOOLTIP_DELAY && bb.GetWidth() < tab->ContentWidth)
    {
        // Enlarge tab display when hovering
        bb.Max.x = bb.Min.x + IM_FLOOR(ImLerp(bb.GetWidth(), tab->ContentWidth, ImSaturate((g.HoveredIdNotActiveTimer - 0.40f) * 6.0f)));
        display_draw_list = GetForegroundDrawList(window);
        TabItemBackground(display_draw_list, bb, flags, GetColorU32(ImGuiCol_TitleBgActive));
    }
#endif

    // Render tab shape
    ImDrawList* display_draw_list = window->DrawList;
    const ImU32 tab_col = GetColorU32((held || hovered) ? ImGuiCol_TabHovered : tab_contents_visible ? (tab_bar_focused ? ImGuiCol_TabActive : ImGuiCol_TabUnfocusedActive) : (tab_bar_focused ? ImGuiCol_Tab : ImGuiCol_TabUnfocused));
    TabItemBackground(display_draw_list, bb, flags, tab_col);
    RenderNavHighlight(bb, id);

    // Select with right mouse button. This is so the common idiom for context menu automatically highlight the current widget.
    const bool hovered_unblocked = IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup);
    if (hovered_unblocked && (IsMouseClicked(1) || IsMouseReleased(1)))
        if (!is_tab_button)
            tab_bar->NextSelectedTabId = id;

    if (tab_bar->Flags & ImGuiTabBarFlags_NoCloseWithMiddleMouseButton)
        flags |= ImGuiTabItemFlags_NoCloseWithMiddleMouseButton;

    // Render tab label, process close button
    const ImGuiID close_button_id = p_open ? GetIDWithSeed("#CLOSE", NULL, id) : 0;
    bool just_closed;
    bool text_clipped;
    TabItemLabelAndCloseButton(display_draw_list, bb, flags, tab_bar->FramePadding, label, id, close_button_id, tab_contents_visible, &just_closed, &text_clipped);
    if (just_closed && p_open != NULL)
    {
        *p_open = false;
        TabBarCloseTab(tab_bar, tab);
    }

    // Restore main window position so user can draw there
    if (want_clip_rect)
        PopClipRect();
    window->DC.CursorPos = backup_main_cursor_pos;

    // Tooltip
    // (Won't work over the close button because ItemOverlap systems messes up with HoveredIdTimer-> seems ok)
    // (We test IsItemHovered() to discard e.g. when another item is active or drag and drop over the tab bar, which g.HoveredId ignores)
    // FIXME: This is a mess.
    // FIXME: We may want disabled tab to still display the tooltip?
    if (text_clipped && g.HoveredId == id && !held && g.HoveredIdNotActiveTimer > g.TooltipSlowDelay && IsItemHovered())
        if (!(tab_bar->Flags & ImGuiTabBarFlags_NoTooltip) && !(tab->Flags & ImGuiTabItemFlags_NoTooltip))
            SetTooltip("%.*s", (int)(FindRenderedTextEnd(label) - label), label);

    IM_ASSERT(!is_tab_button || !(tab_bar->SelectedTabId == tab->ID && is_tab_button)); // TabItemButton should not be selected
    if (is_tab_button)
        return pressed;
    return tab_contents_visible;
}